

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O0

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>_>::
     test_vector(string *input,string *expected)

{
  undefined8 uVar1;
  bool bVar2;
  iterator d_first;
  lazy_ostream *prev;
  cryptox local_d0 [32];
  basic_cstring<const_char> local_b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a0;
  basic_cstring<const_char> local_78;
  basic_cstring<const_char> local_68 [2];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>_> local_38;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>_> digester;
  digest_type actual;
  string *expected_local;
  string *input_local;
  
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>_>::
  basic_message_digester(&local_38);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::end();
  d_first = std::array<unsigned_char,_20UL>::begin
                      ((array<unsigned_char,_20UL> *)
                       ((long)&digester.
                               super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                               ._context + 4));
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha1,160ul>>::operator()
            ((basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha1,160ul>> *)&local_38
             ,local_40,local_48,d_first);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
               ,0x7e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_68,0x2a,&local_78);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a0,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
               ,0x7e);
    to_hex<std::array<unsigned_char,20ul>>
              (local_d0,(array<unsigned_char,_20UL> *)
                        ((long)&digester.
                                super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                                ._context + 4));
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_a0,&local_b0,0x2a,1,2,local_d0,"to_hex(actual)",expected,"expected");
    std::__cxx11::string::~string((string *)local_d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>_>::
  ~basic_message_digester(&local_38);
  return;
}

Assistant:

static void test_vector(const std::string& input,
		                        const std::string& expected) {

			typename Algorithm::digest_type actual;

			basic_message_digester<Algorithm> digester;
			digester(input.begin(), input.end(), actual.begin());

			BOOST_CHECK_EQUAL(to_hex(actual), expected);
		}